

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::removeRows_data(tst_GenericModel *this)

{
  QTestData *pQVar1;
  int local_c [3];
  
  QTest::addColumnInternal(2,"insertCol");
  pQVar1 = (QTestData *)QTest::newRow("No Columns");
  local_c[2] = 0;
  ::operator<<(pQVar1,local_c + 2);
  pQVar1 = (QTestData *)QTest::newRow("One Column");
  local_c[1] = 1;
  ::operator<<(pQVar1,local_c + 1);
  pQVar1 = (QTestData *)QTest::newRow("Multiple Columns");
  local_c[0] = 3;
  ::operator<<(pQVar1,local_c);
  return;
}

Assistant:

void tst_GenericModel::removeRows_data()
{
    QTest::addColumn<int>("insertCol");
#ifndef SKIP_QTBUG_92886
    QTest::newRow("No Columns") << 0;
#endif
    QTest::newRow("One Column") << 1;
    QTest::newRow("Multiple Columns") << 3;
}